

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title-threadsafe.c
# Opt level: O3

int run_test_process_title_threadsafe(void)

{
  int iVar1;
  undefined8 uVar2;
  code *unaff_RBX;
  char *pcVar3;
  long lVar4;
  uv_thread_t getter_thread;
  uv_thread_t setter_threads [4];
  undefined1 auStack_270 [512];
  code *pcStack_70;
  undefined1 local_40 [8];
  undefined1 auStack_38 [40];
  
  iVar1 = uv_set_process_title
                    ("8L2NY0Kdj0XyNFZnmUZigIOfcWjyNr0SkMmUhKw99VLUsZFrvCQQC3XIRfNR8pjyMjXObllled");
  if (iVar1 == 0) {
    iVar1 = uv_thread_create(local_40,getter_thread_body,0);
    if (iVar1 != 0) goto LAB_001681ee;
    lVar4 = 0;
    unaff_RBX = setter_thread_body;
    do {
      iVar1 = uv_thread_create(auStack_38 + lVar4,setter_thread_body,0);
      if (iVar1 != 0) {
        run_test_process_title_threadsafe_cold_3();
        goto LAB_001681e4;
      }
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x20);
    unaff_RBX = (code *)0x0;
    while (iVar1 = uv_thread_join(auStack_38 + (long)unaff_RBX), iVar1 == 0) {
      unaff_RBX = unaff_RBX + 8;
      if (unaff_RBX == (code *)0x20) {
        return 0;
      }
    }
LAB_001681e4:
    run_test_process_title_threadsafe_cold_4();
  }
  run_test_process_title_threadsafe_cold_1();
LAB_001681ee:
  run_test_process_title_threadsafe_cold_2();
  pcStack_70 = unaff_RBX;
  iVar1 = uv_get_process_title(auStack_270,0x200);
  do {
    if (iVar1 != 0) {
      pcVar3 = "0 == uv_get_process_title(buffer, sizeof(buffer))";
      uVar2 = 0x2d;
LAB_001682c3:
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-title-threadsafe.c"
              ,uVar2,pcVar3);
      abort();
    }
    iVar1 = bcmp(auStack_270,
                 "8L2NY0Kdj0XyNFZnmUZigIOfcWjyNr0SkMmUhKw99VLUsZFrvCQQC3XIRfNR8pjyMjXObllled",0x4b);
    if ((((iVar1 != 0) &&
         (iVar1 = bcmp(auStack_270,
                       "jUAcscJN49oLSN8GdmXj2Wo34XX2T2vp2j5khfajNQarlOulp57cE130yiY53ipJFnPyTn5i82",
                       0x4b), iVar1 != 0)) &&
        (iVar1 = bcmp(auStack_270,
                      "9niCI5icXGFS72XudhXqo5alftmZ1tpE7B3cwUmrq0CCDjC84FzBNB8XAHqvpNQfI2QAQG6ztT",
                      0x4b), iVar1 != 0)) &&
       (iVar1 = bcmp(auStack_270,
                     "n8qXVXuG6IEHDpabJgTEiwtpY6LHMZ8MgznnMpdHARu5EywufA6hcBaQfetb0YhEsK0ykDd7JU",
                     0x4b), iVar1 != 0)) {
      pcVar3 = 
      "0 == strcmp(buffer, titles[0]) || 0 == strcmp(buffer, titles[1]) || 0 == strcmp(buffer, titles[2]) || 0 == strcmp(buffer, titles[3])"
      ;
      uVar2 = 0x32;
      goto LAB_001682c3;
    }
    uv_sleep(0);
    iVar1 = uv_get_process_title(auStack_270,0x200);
  } while( true );
}

Assistant:

TEST_IMPL(process_title_threadsafe) {
  uv_thread_t setter_threads[4];
  uv_thread_t getter_thread;
  int i;

#if defined(__sun) || defined(__CYGWIN__) || defined(__MSYS__) || \
    defined(__MVS__) || defined(__PASE__)
  RETURN_SKIP("uv_(get|set)_process_title is not implemented.");
#endif

  ASSERT(0 == uv_set_process_title(titles[0]));
  ASSERT(0 == uv_thread_create(&getter_thread, getter_thread_body, NULL));

  for (i = 0; i < (int) ARRAY_SIZE(setter_threads); i++)
    ASSERT(0 == uv_thread_create(&setter_threads[i], setter_thread_body, NULL));

  for (i = 0; i < (int) ARRAY_SIZE(setter_threads); i++)
    ASSERT(0 == uv_thread_join(&setter_threads[i]));

  return 0;
}